

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O0

void __thiscall
SplitFixture_Empty_Test<const_unsigned_char>::TestBody
          (SplitFixture_Empty_Test<const_unsigned_char> *this)

{
  bool bVar1;
  MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *this_00;
  TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)> *this_01;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  size_t total;
  Matcher<unsigned_long> local_88;
  Matcher<const_void_*> local_70;
  MockSpec<unsigned_long_(const_void_*,_unsigned_long)> local_58;
  unsigned_long local_20;
  size_t size;
  SplitFixture_Empty_Test<const_unsigned_char> *pSStack_10;
  TypeParam buffer;
  SplitFixture_Empty_Test<const_unsigned_char> *this_local;
  
  size._7_1_ = 0;
  local_20 = 0;
  pSStack_10 = this;
  testing::Matcher<const_void_*>::Matcher(&local_70,(void *)((long)&size + 7));
  testing::Matcher<unsigned_long>::Matcher(&local_88,0);
  anon_unknown.dwarf_60765::SplitFixture<const_unsigned_char>::mock_callback::gmock_call
            (&local_58,&(this->super_SplitFixture<const_unsigned_char>).callback,&local_70,&local_88
            );
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::operator()
                      (&local_58,(WithoutMatchers *)((long)&total + 3),(void *)0x0);
  this_01 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
                               ,0x34,"this->callback","call (&buffer, size)");
  testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::Times(this_01,0)
  ;
  testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::~MockSpec(&local_58);
  testing::Matcher<unsigned_long>::~Matcher(&local_88);
  testing::Matcher<const_void_*>::~Matcher(&local_70);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::file::details::
         split<unsigned_short,unsigned_char_const,(anonymous_namespace)::SplitFixture<unsigned_char_const>::mock_callback>
                   ((uchar *)((long)&size + 7),0,
                    &(this->super_SplitFixture<const_unsigned_char>).callback);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_b0,"size","total",&local_20,(unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
               ,0x38,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Empty) {
    TypeParam buffer{};
    constexpr std::size_t size{0};
    EXPECT_CALL (this->callback, call (&buffer, size)).Times (0);

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (&buffer, size, this->callback);
    EXPECT_EQ (size, total);
}